

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<std::array<int,_4UL>_> * __thiscall
tinyusdz::Attribute::get_value<std::array<int,4ul>>
          (optional<std::array<int,_4UL>_> *__return_storage_ptr__,Attribute *this)

{
  optional<std::array<int,_4UL>_> local_2c;
  Attribute *local_18;
  Attribute *this_local;
  
  local_18 = this;
  this_local = (Attribute *)__return_storage_ptr__;
  primvar::PrimVar::get_value<std::array<int,4ul>>(&local_2c,&this->_var);
  nonstd::optional_lite::optional<std::array<int,_4UL>_>::optional<std::array<int,_4UL>,_0>
            (__return_storage_ptr__,&local_2c);
  nonstd::optional_lite::optional<std::array<int,_4UL>_>::~optional(&local_2c);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }